

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyMemory.cpp
# Opt level: O2

Var Js::WebAssemblyMemory::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 initial;
  BOOL BVar6;
  undefined4 *puVar7;
  Var pvVar8;
  DynamicObject *instance;
  WebAssemblyMemory *pWVar9;
  uint32 maximum;
  int in_stack_00000010;
  Arguments local_60;
  undefined1 auStack_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                ,0x3b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00c1a67b;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_50,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((auStack_50._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                ,0x3e,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar4) {
LAB_00c1a67b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pvVar8 = Arguments::GetNewTarget((Arguments *)auStack_50);
  local_60.Values = (Type)args.super_Arguments.Info;
  JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_60);
  if (((ulong)args.super_Arguments.Values & 0x1000000) == 0) {
LAB_00c1a667:
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea00,L"WebAssembly.Memory");
  }
  if (pvVar8 != (Var)0x0) {
    BVar5 = JavascriptOperators::IsUndefinedObject(pvVar8);
    if (BVar5 != 0) goto LAB_00c1a667;
  }
  if ((auStack_50._0_4_ & 0xfffffe) == 0) {
LAB_00c1a653:
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec71,L"descriptor");
  }
  pvVar8 = Arguments::operator[]((Arguments *)auStack_50,1);
  BVar5 = JavascriptOperators::IsObject(pvVar8);
  if (BVar5 == 0) goto LAB_00c1a653;
  pvVar8 = Arguments::operator[]((Arguments *)auStack_50,1);
  instance = VarTo<Js::DynamicObject>(pvVar8);
  pvVar8 = JavascriptOperators::OP_GetProperty(instance,0xeb,pSVar1);
  BVar5 = JavascriptOperators::IsUndefined(pvVar8);
  if (BVar5 != 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec77,L"descriptor.initial");
  }
  initial = WebAssembly::ToNonWrappingUint32(pvVar8,pSVar1);
  bVar3 = DAT_01430302;
  pvVar8 = JavascriptOperators::OP_GetProperty(instance,0xec,pSVar1);
  BVar5 = JavascriptOperators::IsUndefined(pvVar8);
  if (BVar5 == 0) {
    maximum = WebAssembly::ToNonWrappingUint32(pvVar8,pSVar1);
  }
  else {
    maximum = -(uint)bVar3 | 0x10000;
  }
  bVar4 = Wasm::Threads::IsEnabled();
  if (bVar4) {
    pvVar8 = JavascriptOperators::OP_GetProperty(instance,0xed,pSVar1);
    BVar6 = JavascriptOperators::IsUndefined(pvVar8);
    if (BVar6 == 0) {
      bVar4 = JavascriptConversion::ToBool(pvVar8,pSVar1);
      if (BVar5 != 0) {
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e488,(PCWSTR)0x0);
      }
      goto LAB_00c1a614;
    }
  }
  bVar4 = false;
LAB_00c1a614:
  pWVar9 = CreateMemoryObject(initial,maximum,bVar4,pSVar1);
  return pWVar9;
}

Assistant:

Var
WebAssemblyMemory::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    AssertMsg(args.HasArg(), "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

    if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("WebAssembly.Memory"));
    }

    if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject, _u("descriptor"));
    }
    DynamicObject * memoryDescriptor = VarTo<DynamicObject>(args[1]);

    Var initVar = JavascriptOperators::OP_GetProperty(memoryDescriptor, PropertyIds::initial, scriptContext);
    if (Js::JavascriptOperators::IsUndefined(initVar))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedNumber, _u("descriptor.initial"));
    }
    uint32 initial = WebAssembly::ToNonWrappingUint32(initVar, scriptContext);

    uint32 maximum = Wasm::Limits::GetMaxMemoryMaximumPages();
    bool hasMaximum = false;
    Var maxVar = JavascriptOperators::OP_GetProperty(memoryDescriptor, PropertyIds::maximum, scriptContext);
    if (!Js::JavascriptOperators::IsUndefined(maxVar))
    {
        hasMaximum = true;
        maximum = WebAssembly::ToNonWrappingUint32(maxVar, scriptContext);
    }

    bool isShared = false;
    if (Wasm::Threads::IsEnabled())
    {
        Var sharedVar = JavascriptOperators::OP_GetProperty(memoryDescriptor, PropertyIds::shared, scriptContext);
        if (!Js::JavascriptOperators::IsUndefined(sharedVar))
        {
            isShared = JavascriptConversion::ToBool(sharedVar, scriptContext);
            if (!hasMaximum)
            {
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_SharedNoMaximum);
            }
        }
    }

    return CreateMemoryObject(initial, maximum, isShared, scriptContext);
}